

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmganalysis.cpp
# Opt level: O2

void __thiscall TPZMGAnalysis::TPZMGAnalysis(TPZMGAnalysis *this,TPZCompMesh *cmesh)

{
  TPZLinearAnalysis::TPZLinearAnalysis
            (&this->super_TPZLinearAnalysis,&PTR_PTR_017a0ac8,cmesh,true,(ostream *)&std::cout);
  (this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZMGAnalysis_017a09b8;
  TPZStack<TPZCompMesh_*,_10>::TPZStack(&this->fMeshes);
  (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.super_TPZVec<TPZSolutionMatrix_*>.
  fStore = (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.fExtAlloc;
  (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.super_TPZVec<TPZSolutionMatrix_*>.
  fNElements = 0;
  (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.super_TPZVec<TPZSolutionMatrix_*>.
  fNAlloc = 0;
  (this->fSolutions).super_TPZManVector<TPZSolutionMatrix_*,_10>.super_TPZVec<TPZSolutionMatrix_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_017a0e48;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fStore =
       (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.fExtAlloc;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNElements = 0;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNAlloc = 0;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0165a738;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fStore =
       (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.fExtAlloc;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNElements = 0;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNAlloc = 0;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0165a738;
  TPZStack<TPZCompMesh_*,_10>::Push(&this->fMeshes,cmesh);
  return;
}

Assistant:

TPZMGAnalysis::TPZMGAnalysis(TPZCompMesh *cmesh) : TPZLinearAnalysis(cmesh) {
	fMeshes.Push(cmesh);
}